

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

void __thiscall cursespp::App::SetTitle(App *this,string *title)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  string *psVar5;
  
  psVar5 = &this->appTitle;
  std::__cxx11::string::_M_assign((string *)psVar5);
  pcVar2 = getenv("TERM");
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcmp(pcVar2,"screen");
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b_",2);
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ac338);
      }
      else {
        sVar3 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
      }
      pcVar2 = "\x1b\\";
      lVar4 = 2;
    }
    else {
      iVar1 = strncmp(pcVar2,"xterm",5);
      if (iVar1 != 0) {
        iVar1 = strncmp(pcVar2,"rxvt",4);
        if (iVar1 != 0) {
          iVar1 = strcmp(pcVar2,"Eterm");
          if (iVar1 != 0) goto LAB_00153d79;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b]0;",4);
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ac338);
      }
      else {
        sVar3 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
      }
      pcVar2 = "\a";
      lVar4 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar4);
  }
LAB_00153d79:
  Window::InvalidateScreen();
  return;
}

Assistant:

void App::SetTitle(const std::string& title) {
    this->appTitle = title;
#ifdef WIN32
    PDC_set_title(this->appTitle.c_str());
    win32::SetAppTitle(this->appTitle);
#else
    /* stolen from https://github.com/cmus/cmus/blob/fead80b207b79ae6d10ab2b1601b11595d719908/ui_curses.c#L2349 */
    const char* term = getenv("TERM");
    if (term) {
        if (!strcmp(term, "screen")) {
            std::cout << "\033_" << this->appTitle.c_str() << "\033\\";
        }
        else if (!strncmp(term, "xterm", 5) ||
                 !strncmp(term, "rxvt", 4) ||
                 !strcmp(term, "Eterm"))
        {
            std::cout << "\033]0;" << this->appTitle.c_str() << "\007";
        }
    }
    Window::InvalidateScreen();
#endif
}